

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

Symbol * __thiscall slang::ast::ExplicitImportSymbol::importedSymbol(ExplicitImportSymbol *this)

{
  SyntaxNode *pSVar1;
  PackageImportItemSyntax *pPVar2;
  SourceLocation SVar3;
  PackageSymbol *pPVar4;
  Symbol *pSVar5;
  Diagnostic *pDVar6;
  SourceLocation in_R8;
  Scope *this_00;
  string_view packageName;
  
  if (this->initialized == false) {
    this->initialized = true;
    this_00 = (this->super_Symbol).parentScope;
    if (this_00 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x50,"const Symbol *slang::ast::ExplicitImportSymbol::importedSymbol() const");
    }
    pSVar1 = (this->super_Symbol).originatingSyntax;
    if (pSVar1 == (SyntaxNode *)0x0) {
      SVar3 = (this->super_Symbol).location;
    }
    else {
      pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>(pSVar1);
      SVar3 = parsing::Token::location(&pPVar2->package);
    }
    packageName._M_str = (char *)this_00;
    packageName._M_len = (size_t)(this->packageName)._M_str;
    pPVar4 = findPackage((ast *)(this->packageName)._M_len,packageName,(Scope *)SVar3,in_R8);
    this->package_ = pPVar4;
    if (pPVar4 == (PackageSymbol *)0x0) {
      return (Symbol *)0x0;
    }
    pSVar5 = PackageSymbol::findForImport(pPVar4,this->importName);
    this->import = pSVar5;
    if (pSVar5 == (Symbol *)0x0) {
      if ((this->importName)._M_len != 0) {
        pSVar1 = (this->super_Symbol).originatingSyntax;
        if (pSVar1 == (SyntaxNode *)0x0) {
          SVar3 = (this->super_Symbol).location;
        }
        else {
          pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>(pSVar1);
          SVar3 = parsing::Token::location(&pPVar2->item);
        }
        pDVar6 = Scope::addDiag(this_00,(DiagCode)0x34000a,SVar3);
        pDVar6 = Diagnostic::operator<<(pDVar6,this->importName);
        Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
      }
    }
    else {
      do {
        pSVar5 = this_00->thisSym;
        if (pSVar5->kind == Package) {
          pPVar4 = Symbol::as<slang::ast::PackageSymbol>(pSVar5);
          PackageSymbol::noteImport(pPVar4,this->import);
          break;
        }
        this_00 = pSVar5->parentScope;
      } while (this_00 != (Scope *)0x0);
    }
  }
  return this->import;
}

Assistant:

const Symbol* ExplicitImportSymbol::importedSymbol() const {
    if (!initialized) {
        initialized = true;

        const Scope* scope = getParentScope();
        ASSERT(scope);

        auto loc = location;
        if (auto syntax = getSyntax())
            loc = syntax->as<PackageImportItemSyntax>().package.location();

        package_ = findPackage(packageName, *scope, loc);
        if (!package_)
            return nullptr;

        import = package_->findForImport(importName);
        if (!import) {
            if (!importName.empty()) {
                loc = location;
                if (auto syntax = getSyntax())
                    loc = syntax->as<PackageImportItemSyntax>().item.location();

                auto& diag = scope->addDiag(diag::UnknownPackageMember, loc);
                diag << importName << name;
            }
        }
        else {
            // If we are doing this lookup from a scope that is within a package declaration
            // we should note that fact so that it can later be exported if desired.
            do {
                auto& sym = scope->asSymbol();
                if (sym.kind == SymbolKind::Package) {
                    sym.as<PackageSymbol>().noteImport(*import);
                    break;
                }

                scope = sym.getParentScope();
            } while (scope);
        }
    }
    return import;
}